

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_transfer_metadata(mcpl_file_t source,mcpl_outfile_t target)

{
  mcpl_outfile_t of;
  mcpl_file_t ff;
  mcpl_outfile_t of_00;
  mcpl_outfile_t of_01;
  mcpl_outfile_t of_02;
  mcpl_outfile_t of_03;
  mcpl_outfile_t of_04;
  mcpl_outfile_t of_05;
  mcpl_file_t ff_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  int32_t iVar4;
  char **ppcVar5;
  mcpl_file_t in_RDI;
  double dVar6;
  double uw;
  int32_t updg;
  int res;
  int ii;
  char *data;
  uint32_t ldata;
  int nblobs;
  char **blobkeys;
  uint i;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar7;
  uint32_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int iVar8;
  mcpl_outfile_t in_stack_ffffffffffffffd0;
  uint local_14;
  
  iVar1 = mcpl_hdr_little_endian(in_RDI);
  iVar2 = mcpl_platform_is_little_endian();
  if (iVar1 != iVar2) {
    mcpl_error((char *)0x1045c7);
  }
  mcpl_hdr_srcname(in_RDI);
  of.internal._4_4_ = iVar1;
  of.internal._0_4_ = in_stack_ffffffffffffffb0;
  mcpl_hdr_set_srcname(of,(char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  local_14 = 0;
  while (uVar7 = local_14, uVar3 = mcpl_hdr_ncomments(in_RDI), uVar7 < uVar3) {
    ff.internal._4_4_ = iVar1;
    ff.internal._0_4_ = uVar7;
    mcpl_hdr_comment(ff,in_stack_ffffffffffffffac);
    of_05.internal._4_4_ = in_stack_ffffffffffffffc4;
    of_05.internal._0_4_ = in_stack_ffffffffffffffc0;
    mcpl_hdr_add_comment(of_05,(char *)in_stack_ffffffffffffffb8);
    local_14 = local_14 + 1;
  }
  ppcVar5 = mcpl_hdr_blobkeys(in_RDI);
  if (ppcVar5 != (char **)0x0) {
    iVar2 = mcpl_hdr_nblobs(in_RDI);
    for (iVar8 = 0; iVar8 < iVar2; iVar8 = iVar8 + 1) {
      ff_00.internal._4_4_ = iVar8;
      ff_00.internal._0_4_ = in_stack_ffffffffffffffc8;
      in_stack_ffffffffffffffc8 =
           mcpl_hdr_blob(ff_00,(char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                         ,in_stack_ffffffffffffffb8,(char **)CONCAT44(iVar1,uVar7));
      if (in_stack_ffffffffffffffc8 == 0) {
        mcpl_error((char *)0x10469e);
      }
      mcpl_hdr_add_data(in_stack_ffffffffffffffd0,(char *)CONCAT44(iVar8,in_stack_ffffffffffffffc8),
                        in_stack_ffffffffffffffc4,(char *)in_stack_ffffffffffffffb8);
    }
  }
  iVar2 = mcpl_hdr_has_userflags(in_RDI);
  if (iVar2 != 0) {
    of_00.internal._4_4_ = iVar1;
    of_00.internal._0_4_ = uVar7;
    mcpl_enable_userflags(of_00);
  }
  iVar2 = mcpl_hdr_has_polarisation(in_RDI);
  if (iVar2 != 0) {
    of_01.internal._4_4_ = iVar1;
    of_01.internal._0_4_ = uVar7;
    mcpl_enable_polarisation(of_01);
  }
  iVar2 = mcpl_hdr_has_doubleprec(in_RDI);
  if (iVar2 != 0) {
    of_02.internal._4_4_ = iVar1;
    of_02.internal._0_4_ = uVar7;
    mcpl_enable_doubleprec(of_02);
  }
  iVar4 = mcpl_hdr_universal_pdgcode(in_RDI);
  if (iVar4 != 0) {
    of_03.internal._4_4_ = iVar1;
    of_03.internal._0_4_ = uVar7;
    mcpl_enable_universal_pdgcode(of_03,in_stack_ffffffffffffffac);
  }
  dVar6 = mcpl_hdr_universal_weight(in_RDI);
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    of_04.internal._4_4_ = iVar1;
    of_04.internal._0_4_ = uVar7;
    mcpl_enable_universal_weight
              (of_04,(double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  return;
}

Assistant:

void mcpl_transfer_metadata(mcpl_file_t source, mcpl_outfile_t target)
{
  //Note that MCPL format version 2 and 3 have the same meta-data in the header,
  //except of course the version number itself.

  if (mcpl_hdr_little_endian(source) != mcpl_platform_is_little_endian())
    mcpl_error("mcpl_transfer_metadata can only work on files with same endianness as current platform.");

  mcpl_hdr_set_srcname(target,mcpl_hdr_srcname(source));
  unsigned i;
  for (i = 0; i < mcpl_hdr_ncomments(source); ++i)
    mcpl_hdr_add_comment(target,mcpl_hdr_comment(source,i));
  const char** blobkeys = mcpl_hdr_blobkeys(source);
  if (blobkeys) {
    int nblobs = mcpl_hdr_nblobs(source);
    uint32_t ldata;
    const char * data;
    int ii;
    for (ii = 0; ii < nblobs; ++ii) {
      int res = mcpl_hdr_blob(source,blobkeys[ii],&ldata,&data);
      if (!res)
        mcpl_error("unexpected key problem in mcpl_transfer_metadata");
      (void)res;
      mcpl_hdr_add_data(target, blobkeys[ii], ldata, data);
    }
  }
  if (mcpl_hdr_has_userflags(source))
    mcpl_enable_userflags(target);
  if (mcpl_hdr_has_polarisation(source))
    mcpl_enable_polarisation(target);
  if (mcpl_hdr_has_doubleprec(source))
    mcpl_enable_doubleprec(target);
  int32_t updg = mcpl_hdr_universal_pdgcode(source);
  if (updg)
    mcpl_enable_universal_pdgcode(target,updg);
  double uw = mcpl_hdr_universal_weight(source);
  if (uw)
    mcpl_enable_universal_weight(target,uw);
}